

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcSIUnit::~IfcSIUnit(IfcSIUnit *this)

{
  _func_int *p_Var1;
  long *plVar2;
  _func_int *p_Var3;
  
  p_Var3 = (this->super_IfcNamedUnit).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>
           ._vptr_ObjectHelper[-3];
  p_Var1 = (_func_int *)
           ((long)&(this->super_IfcNamedUnit).
                   super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcNamedUnit,_2UL>._vptr_ObjectHelper
           + (long)p_Var3);
  plVar2 = (long *)((this->Name).field_2._M_local_buf + (long)p_Var3);
  plVar2[-0x10] = (long)&PTR__IfcSIUnit_0085e948;
  plVar2[2] = (long)&PTR__IfcSIUnit_0085e998;
  plVar2[-9] = (long)&PTR__IfcSIUnit_0085e970;
  if ((long *)plVar2[-2] != plVar2) {
    operator_delete((long *)plVar2[-2],*plVar2 + 1);
  }
  if (*(code **)(p_Var1 + 0x48) != p_Var1 + 0x58) {
    operator_delete(*(code **)(p_Var1 + 0x48),*(long *)(p_Var1 + 0x58) + 1);
  }
  *(undefined8 *)p_Var1 = 0x85e9c0;
  *(undefined8 *)(p_Var1 + 0x90) = 0x85e9e8;
  if (*(code **)(p_Var1 + 0x18) != p_Var1 + 0x28) {
    operator_delete(*(code **)(p_Var1 + 0x18),*(long *)(p_Var1 + 0x28) + 1);
    return;
  }
  return;
}

Assistant:

IfcSIUnit() : Object("IfcSIUnit") {}